

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.h
# Opt level: O2

void install_symbol(void *context,fb_symbol_t *sym)

{
  undefined1 *puVar1;
  fb_token_t *pfVar2;
  long lVar3;
  undefined8 *puVar4;
  fb_compound_type_t *pfVar5;
  fb_scope_t *pfVar6;
  size_t sVar7;
  undefined1 *puVar8;
  undefined1 *__dest;
  
  pfVar5 = get_compound_if_visible(*(fb_schema_t **)((long)context + 0x58),sym);
  if (pfVar5 != (fb_compound_type_t *)0x0) {
    puVar1 = *(undefined1 **)((long)context + 0x50);
    __dest = puVar1;
    if (*context != 0) {
      pfVar6 = pfVar5->scope;
      while (pfVar6 = (fb_scope_t *)pfVar6->name, pfVar6 != (fb_scope_t *)0x0) {
        pfVar2 = (fb_token_t *)(pfVar6->symbol_index).table;
        sVar7 = (size_t)(int)pfVar2->len;
        memcpy(__dest,pfVar2->text,sVar7);
        puVar8 = __dest + sVar7;
        __dest = puVar8 + 1;
        *puVar8 = 0x2e;
      }
    }
    sVar7 = (size_t)(int)sym->ident->len;
    memcpy(__dest,sym->ident->text,sVar7);
    __dest[sVar7] = 0;
    *(undefined1 **)((long)context + 0x50) = __dest + sVar7 + 1;
    if ((ulong)sym->kind < 5) {
      lVar3 = *(long *)(&DAT_0013bb10 + (ulong)sym->kind * 8);
      puVar4 = *(undefined8 **)((long)context + lVar3);
      *puVar4 = sym;
      puVar4[1] = puVar1;
      *(undefined8 **)((long)context + lVar3) = puVar4 + 2;
    }
  }
  return;
}

Assistant:

static void install_symbol(void *context, fb_symbol_t *sym)
{
    catalog_t *catalog = context;
    fb_ref_t *scope_name;
    int n = 0;
    char *s, *name;
    fb_compound_type_t *ct;
    
    if (!(ct = get_compound_if_visible(catalog->schema, sym))) {
        return;
    }

    s = catalog->next_name;
    name = s;
    if (catalog->qualify_names) {
        scope_name = ct->scope->name;
        while (scope_name) {
            n = (int)scope_name->ident->len;
            memcpy(s, scope_name->ident->text, (size_t)n);
            s += n;
            *s++ = '.';
            scope_name = scope_name->link;
        }
    }
    n = (int)sym->ident->len;
    memcpy(s, sym->ident->text, (size_t)n);
    s += n;
    *s++ = '\0';
    catalog->next_name = s;

    switch (sym->kind) {
    case fb_is_struct:
    case fb_is_table:
        catalog->next_object->ct = (fb_compound_type_t *)sym;
        catalog->next_object->name = name;
        catalog->next_object++;
        break;
    case fb_is_union:
    case fb_is_enum:
        catalog->next_enum->ct = (fb_compound_type_t *)sym;
        catalog->next_enum->name = name;
        catalog->next_enum++;
        break;
    case fb_is_rpc_service:
        catalog->next_service->ct = (fb_compound_type_t *)sym;
        catalog->next_service->name = name;
        catalog->next_service++;
        break;
    default: break;
    }
}